

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O2

void MeshLib::Trait::updateUV(string *traitString,Point *p)

{
  string attval;
  string attname;
  char str [256];
  allocator local_159;
  string local_158;
  string local_138;
  allocator local_118 [264];
  
  std::__cxx11::string::string((string *)&local_138,"uv",local_118);
  sprintf((char *)local_118,"%g %g",p->v[0],p->v[1]);
  std::__cxx11::string::string((string *)&local_158,(char *)local_118,&local_159);
  updateTraitString(traitString,&local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  return;
}

Assistant:

void Trait::updateUV(std::string &traitString, Point p)
{
	std::string attname("uv");
	char str[256];
	sprintf(str, "%g %g", p[0], p[1]);
	std::string attval( str );
	Trait::updateTraitString ( traitString, attname, attval );
}